

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.c
# Opt level: O1

char * luaF_getlocalname(Proto *f,int param_2,int pc,ravi_type_map *type,TString **usertype)

{
  LocVar *pLVar1;
  char *pcVar2;
  long lVar3;
  
  if (0 < (long)f->sizelocvars) {
    pLVar1 = f->locvars;
    lVar3 = 0;
    do {
      if (pc < *(int *)((long)&pLVar1->startpc + lVar3)) break;
      if (pc < *(int *)((long)&pLVar1->endpc + lVar3)) {
        param_2 = param_2 + -1;
        if (param_2 == 0) {
          *type = *(ravi_type_map *)((long)&pLVar1->ravi_type_map + lVar3);
          *usertype = *(TString **)((long)&pLVar1->usertype + lVar3);
          lVar3 = *(long *)((long)&f->locvars->varname + lVar3);
          pcVar2 = (char *)(lVar3 + 0x18);
          if (lVar3 == 0) {
            pcVar2 = (char *)0x0;
          }
          return pcVar2;
        }
      }
      lVar3 = lVar3 + 0x20;
    } while ((long)f->sizelocvars * 0x20 != lVar3);
  }
  *type = 0xffffffff;
  *usertype = (TString *)0x0;
  return (char *)0x0;
}

Assistant:

const char *luaF_getlocalname (const Proto *f, int local_number, int pc, ravi_type_map *type, TString **usertype) {
  int i;
  for (i = 0; i<f->sizelocvars && f->locvars[i].startpc <= pc; i++) {
    if (pc < f->locvars[i].endpc) {  /* is variable active? */
      local_number--;
      if (local_number == 0) {
        *type = f->locvars[i].ravi_type_map;
        *usertype = f->locvars[i].usertype;
        if (f->locvars[i].varname == NULL)
          return NULL;
        return getstr(f->locvars[i].varname);
      }
    }
  }
  *type = RAVI_TM_ANY;
  *usertype = NULL;
  return NULL;  /* not found */
}